

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O0

void Rho(Sarray *A,Sarray *B)

{
  value_type vVar1;
  reference pvVar2;
  reference pvVar3;
  uint64_t uVar4;
  Sarray *B_local;
  Sarray *A_local;
  
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  vVar1 = *pvVar3;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  *pvVar3 = vVar1;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  uVar4 = rot(*pvVar3,1);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  uVar4 = rot(*pvVar3,3);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  uVar4 = rot(*pvVar3,6);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  uVar4 = rot(*pvVar3,10);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  uVar4 = rot(*pvVar3,0xf);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  uVar4 = rot(*pvVar3,0x15);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  uVar4 = rot(*pvVar3,0x1c);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  uVar4 = rot(*pvVar3,0x24);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  uVar4 = rot(*pvVar3,0x2d);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  uVar4 = rot(*pvVar3,0x37);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  uVar4 = rot(*pvVar3,2);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  uVar4 = rot(*pvVar3,0xe);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  uVar4 = rot(*pvVar3,0x1b);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  uVar4 = rot(*pvVar3,0x29);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  uVar4 = rot(*pvVar3,0x38);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  uVar4 = rot(*pvVar3,8);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,3);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  uVar4 = rot(*pvVar3,0x19);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,3);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  uVar4 = rot(*pvVar3,0x2b);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  uVar4 = rot(*pvVar3,0x3e);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,0);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  uVar4 = rot(*pvVar3,0x12);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,0);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  uVar4 = rot(*pvVar3,0x27);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,2);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  uVar4 = rot(*pvVar3,0x3d);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,2);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,4);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  uVar4 = rot(*pvVar3,0x14);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,4);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  *pvVar3 = uVar4;
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](A,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  uVar4 = rot(*pvVar3,0x2c);
  pvVar2 = std::
           vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           ::operator[](B,1);
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](pvVar2,1);
  *pvVar3 = uVar4;
  return;
}

Assistant:

void Rho(Sarray &A, Sarray &B){
    B[0][0] = A[0][0];
    B[1][0] = rot(A[1][0], 1);
    B[0][2] = rot(A[0][2], 3);
    B[2][1] = rot(A[2][1], 6);
    B[1][2] = rot(A[1][2], 10);
    B[2][3] = rot(A[2][3], 15);
    B[3][3] = rot(A[3][3], 21);
    B[3][0] = rot(A[3][0], 28);
    B[0][1] = rot(A[0][1], 36);
    B[1][3] = rot(A[1][3], 45);
    B[3][1] = rot(A[3][1], 55);
    B[1][4] = rot(A[1][4], 2);
    B[4][4] = rot(A[4][4], 14);
    B[4][0] = rot(A[4][0], 27);
    B[0][3] = rot(A[0][3], 41);
    B[3][4] = rot(A[3][4], 56);
    B[4][3] = rot(A[4][3], 8);
    B[3][2] = rot(A[3][2], 25);
    B[2][2] = rot(A[2][2], 43);
    B[2][0] = rot(A[2][0], 62);
    B[0][4] = rot(A[0][4], 18);
    B[4][2] = rot(A[4][2], 39);
    B[2][4] = rot(A[2][4], 61);
    B[4][1] = rot(A[4][1], 20);
    B[1][1] = rot(A[1][1], 44);
}